

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ReorderGlobals.cpp
# Opt level: O2

void __thiscall wasm::ReorderGlobals::run(ReorderGlobals *this,Module *module)

{
  char **this_00;
  pointer puVar1;
  __node_base _Var2;
  bool bVar3;
  mapped_type *pmVar4;
  unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_> *global;
  pointer puVar5;
  undefined1 local_270 [8];
  UseCountScanner scanner;
  undefined1 local_c8 [8];
  NameCountMap counts;
  unordered_map<wasm::Name,_unsigned_int,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_unsigned_int>_>_>
  sortedIndexes;
  Iterator __end2;
  Name global_1;
  Iterator __begin2;
  
  puVar5 = (module->globals).
           super__Vector_base<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>,_std::allocator<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  puVar1 = (module->globals).
           super__Vector_base<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>,_std::allocator<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if ((0x3ff < (ulong)((long)puVar1 - (long)puVar5)) || (this->always == true)) {
    local_c8 = (undefined1  [8])&counts._M_h._M_rehash_policy._M_next_resize;
    counts._M_h._M_buckets = (__buckets_ptr)0x1;
    counts._M_h._M_bucket_count = 0;
    counts._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
    counts._M_h._M_element_count._0_4_ = 0x3f800000;
    counts._M_h._M_rehash_policy._M_max_load_factor = 0.0;
    counts._M_h._M_rehash_policy._4_4_ = 0;
    counts._M_h._M_rehash_policy._M_next_resize = 0;
    for (; puVar5 != puVar1; puVar5 = puVar5 + 1) {
      std::__detail::
      _Map_base<wasm::Name,_std::pair<const_wasm::Name,_std::atomic<unsigned_int>_>,_std::allocator<std::pair<const_wasm::Name,_std::atomic<unsigned_int>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
      ::operator[]((_Map_base<wasm::Name,_std::pair<const_wasm::Name,_std::atomic<unsigned_int>_>,_std::allocator<std::pair<const_wasm::Name,_std::atomic<unsigned_int>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                    *)local_c8,
                   (key_type *)
                   (puVar5->_M_t).
                   super___uniq_ptr_impl<wasm::Global,_std::default_delete<wasm::Global>_>._M_t.
                   super__Tuple_impl<0UL,_wasm::Global_*,_std::default_delete<wasm::Global>_>.
                   super__Head_base<0UL,_wasm::Global_*,_false>._M_head_impl);
    }
    scanner.
    super_WalkerPass<wasm::PostWalker<wasm::UseCountScanner,_wasm::Visitor<wasm::UseCountScanner,_void>_>_>
    .super_Pass.runner =
         (PassRunner *)
         &scanner.
          super_WalkerPass<wasm::PostWalker<wasm::UseCountScanner,_wasm::Visitor<wasm::UseCountScanner,_void>_>_>
          .super_Pass.name._M_string_length;
    scanner.
    super_WalkerPass<wasm::PostWalker<wasm::UseCountScanner,_wasm::Visitor<wasm::UseCountScanner,_void>_>_>
    .super_Pass._vptr_Pass = (_func_int **)0x0;
    scanner.
    super_WalkerPass<wasm::PostWalker<wasm::UseCountScanner,_wasm::Visitor<wasm::UseCountScanner,_void>_>_>
    .super_Pass.name._M_dataplus._M_p = (pointer)0x0;
    scanner.
    super_WalkerPass<wasm::PostWalker<wasm::UseCountScanner,_wasm::Visitor<wasm::UseCountScanner,_void>_>_>
    .super_Pass.name._M_string_length._0_1_ = 0;
    scanner.
    super_WalkerPass<wasm::PostWalker<wasm::UseCountScanner,_wasm::Visitor<wasm::UseCountScanner,_void>_>_>
    .super_Pass.name.field_2._8_8_ = 0;
    scanner.
    super_WalkerPass<wasm::PostWalker<wasm::UseCountScanner,_wasm::Visitor<wasm::UseCountScanner,_void>_>_>
    .super_PostWalker<wasm::UseCountScanner,_wasm::Visitor<wasm::UseCountScanner,_void>_>.
    super_Walker<wasm::UseCountScanner,_wasm::Visitor<wasm::UseCountScanner,_void>_>.replacep =
         (Expression **)0x0;
    scanner.
    super_WalkerPass<wasm::PostWalker<wasm::UseCountScanner,_wasm::Visitor<wasm::UseCountScanner,_void>_>_>
    .super_PostWalker<wasm::UseCountScanner,_wasm::Visitor<wasm::UseCountScanner,_void>_>.
    super_Walker<wasm::UseCountScanner,_wasm::Visitor<wasm::UseCountScanner,_void>_>.stack.fixed.
    _M_elems[9].currp = (Expression **)0x0;
    scanner.
    super_WalkerPass<wasm::PostWalker<wasm::UseCountScanner,_wasm::Visitor<wasm::UseCountScanner,_void>_>_>
    .super_PostWalker<wasm::UseCountScanner,_wasm::Visitor<wasm::UseCountScanner,_void>_>.
    super_Walker<wasm::UseCountScanner,_wasm::Visitor<wasm::UseCountScanner,_void>_>.stack.flexible.
    super__Vector_base<wasm::Walker<wasm::UseCountScanner,_wasm::Visitor<wasm::UseCountScanner,_void>_>::Task,_std::allocator<wasm::Walker<wasm::UseCountScanner,_wasm::Visitor<wasm::UseCountScanner,_void>_>::Task>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    scanner.
    super_WalkerPass<wasm::PostWalker<wasm::UseCountScanner,_wasm::Visitor<wasm::UseCountScanner,_void>_>_>
    .super_PostWalker<wasm::UseCountScanner,_wasm::Visitor<wasm::UseCountScanner,_void>_>.
    super_Walker<wasm::UseCountScanner,_wasm::Visitor<wasm::UseCountScanner,_void>_>.stack.flexible.
    super__Vector_base<wasm::Walker<wasm::UseCountScanner,_wasm::Visitor<wasm::UseCountScanner,_void>_>::Task,_std::allocator<wasm::Walker<wasm::UseCountScanner,_wasm::Visitor<wasm::UseCountScanner,_void>_>::Task>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    scanner.
    super_WalkerPass<wasm::PostWalker<wasm::UseCountScanner,_wasm::Visitor<wasm::UseCountScanner,_void>_>_>
    .super_PostWalker<wasm::UseCountScanner,_wasm::Visitor<wasm::UseCountScanner,_void>_>.
    super_Walker<wasm::UseCountScanner,_wasm::Visitor<wasm::UseCountScanner,_void>_>.stack.flexible.
    super__Vector_base<wasm::Walker<wasm::UseCountScanner,_wasm::Visitor<wasm::UseCountScanner,_void>_>::Task,_std::allocator<wasm::Walker<wasm::UseCountScanner,_wasm::Visitor<wasm::UseCountScanner,_void>_>::Task>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    scanner.
    super_WalkerPass<wasm::PostWalker<wasm::UseCountScanner,_wasm::Visitor<wasm::UseCountScanner,_void>_>_>
    .super_PostWalker<wasm::UseCountScanner,_wasm::Visitor<wasm::UseCountScanner,_void>_>.
    super_Walker<wasm::UseCountScanner,_wasm::Visitor<wasm::UseCountScanner,_void>_>.currFunction =
         (Function *)0x0;
    local_270 = (undefined1  [8])&PTR__WalkerPass_00e20b98;
    scanner.
    super_WalkerPass<wasm::PostWalker<wasm::UseCountScanner,_wasm::Visitor<wasm::UseCountScanner,_void>_>_>
    .super_PostWalker<wasm::UseCountScanner,_wasm::Visitor<wasm::UseCountScanner,_void>_>.
    super_Walker<wasm::UseCountScanner,_wasm::Visitor<wasm::UseCountScanner,_void>_>.currModule =
         (Module *)local_c8;
    WalkerPass<wasm::PostWalker<wasm::UseCountScanner,_wasm::Visitor<wasm::UseCountScanner,_void>_>_>
    ::run((WalkerPass<wasm::PostWalker<wasm::UseCountScanner,_wasm::Visitor<wasm::UseCountScanner,_void>_>_>
           *)local_270,(this->super_Pass).runner,module);
    WalkerPass<wasm::PostWalker<wasm::UseCountScanner,_wasm::Visitor<wasm::UseCountScanner,_void>_>_>
    ::runOnModuleCode((WalkerPass<wasm::PostWalker<wasm::UseCountScanner,_wasm::Visitor<wasm::UseCountScanner,_void>_>_>
                       *)local_270,(this->super_Pass).runner,module);
    counts._M_h._M_single_bucket =
         (__node_base_ptr)&sortedIndexes._M_h._M_rehash_policy._M_next_resize;
    sortedIndexes._M_h._M_buckets = (__buckets_ptr)0x1;
    sortedIndexes._M_h._M_bucket_count = 0;
    sortedIndexes._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
    sortedIndexes._M_h._M_element_count._0_4_ = 0x3f800000;
    sortedIndexes._M_h._M_rehash_policy._M_max_load_factor = 0.0;
    sortedIndexes._M_h._M_rehash_policy._4_4_ = 0;
    sortedIndexes._M_h._M_rehash_policy._M_next_resize = 0;
    run(wasm::Module*)::DependencySort::DependencySort(wasm::Module&,std::unordered_map<wasm::
    Name,std::atomic<unsigned_int>,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::
    allocator<std::pair<wasm::Name_const,std::atomic<unsigned_int>_>_>_>_const__
              (&scanner.counts,module,(NameCountMap *)local_c8);
    TopologicalSort<wasm::Name,_DependencySort>::stepToNext
              ((TopologicalSort<wasm::Name,_DependencySort> *)&scanner.counts);
    sortedIndexes._M_h._M_single_bucket = (__node_base_ptr)0x0;
    this_00 = &global_1.super_IString.str._M_str;
    global_1.super_IString.str._M_str = (char *)&scanner.counts;
    while( true ) {
      bVar3 = TopologicalSort<wasm::Name,_DependencySort>::Iterator::operator!=
                        ((Iterator *)this_00,(Iterator *)&sortedIndexes._M_h._M_single_bucket);
      _Var2 = sortedIndexes._M_h._M_before_begin;
      if (!bVar3) break;
      __end2.parent =
           *(TopologicalSort<wasm::Name,_DependencySort> **)
            (*(long *)(global_1.super_IString.str._M_str + 8) + -0x10);
      global_1.super_IString.str._M_len =
           *(size_t *)(*(long *)(global_1.super_IString.str._M_str + 8) + -8);
      pmVar4 = std::__detail::
               _Map_base<wasm::Name,_std::pair<const_wasm::Name,_unsigned_int>,_std::allocator<std::pair<const_wasm::Name,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
               ::operator[]((_Map_base<wasm::Name,_std::pair<const_wasm::Name,_unsigned_int>,_std::allocator<std::pair<const_wasm::Name,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                             *)&counts._M_h._M_single_bucket,(key_type *)&__end2);
      *pmVar4 = (mapped_type)_Var2._M_nxt;
      TopologicalSort<wasm::Name,_DependencySort>::Iterator::operator++((Iterator *)this_00);
    }
    run::DependencySort::~DependencySort((DependencySort *)&scanner.counts);
    std::
    __sort<__gnu_cxx::__normal_iterator<std::unique_ptr<wasm::Global,std::default_delete<wasm::Global>>*,std::vector<std::unique_ptr<wasm::Global,std::default_delete<wasm::Global>>,std::allocator<std::unique_ptr<wasm::Global,std::default_delete<wasm::Global>>>>>,__gnu_cxx::__ops::_Iter_comp_iter<wasm::ReorderGlobals::run(wasm::Module*)::_lambda(std::unique_ptr<wasm::Global,std::default_delete<wasm::Global>>const&,std::unique_ptr<wasm::Global,std::default_delete<wasm::Global>>const&)_1_>>
              ((module->globals).
               super__Vector_base<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>,_std::allocator<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start,
               (module->globals).
               super__Vector_base<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>,_std::allocator<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish,
               (_Iter_comp_iter<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_dcodeIO[P]binaryen_src_passes_ReorderGlobals_cpp:152:7)>
                )&counts._M_h._M_single_bucket);
    Module::updateMaps(module);
    std::
    _Hashtable<wasm::Name,_std::pair<const_wasm::Name,_unsigned_int>,_std::allocator<std::pair<const_wasm::Name,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
    ::~_Hashtable((_Hashtable<wasm::Name,_std::pair<const_wasm::Name,_unsigned_int>,_std::allocator<std::pair<const_wasm::Name,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                   *)&counts._M_h._M_single_bucket);
    WalkerPass<wasm::PostWalker<wasm::UseCountScanner,_wasm::Visitor<wasm::UseCountScanner,_void>_>_>
    ::~WalkerPass((WalkerPass<wasm::PostWalker<wasm::UseCountScanner,_wasm::Visitor<wasm::UseCountScanner,_void>_>_>
                   *)local_270);
    std::
    _Hashtable<wasm::Name,_std::pair<const_wasm::Name,_std::atomic<unsigned_int>_>,_std::allocator<std::pair<const_wasm::Name,_std::atomic<unsigned_int>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
    ::~_Hashtable((_Hashtable<wasm::Name,_std::pair<const_wasm::Name,_std::atomic<unsigned_int>_>,_std::allocator<std::pair<const_wasm::Name,_std::atomic<unsigned_int>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                   *)local_c8);
  }
  return;
}

Assistant:

void run(Module* module) override {
    if (module->globals.size() < 128 && !always) {
      // The module has so few globals that they all fit in a single-byte U32LEB
      // value, so no reordering we can do can actually decrease code size. Note
      // that this is the common case with wasm MVP modules where the only
      // globals are typically the stack pointer and perhaps a handful of others
      // (however, features like wasm GC there may be a great many globals).
      return;
    }

    NameCountMap counts;
    // Fill in info, as we'll operate on it in parallel.
    for (auto& global : module->globals) {
      counts[global->name];
    }

    // Count uses.
    UseCountScanner scanner(counts);
    scanner.run(getPassRunner(), module);
    scanner.runOnModuleCode(getPassRunner(), module);

    // Do a toplogical sort to ensure we keep dependencies before the things
    // that need them. For example, if $b's definition depends on $a then $b
    // must appear later:
    //
    //   (global $a i32 (i32.const 10))
    //   (global $b i32 (global.get $a)) ;; $b depends on $a
    //
    struct DependencySort : TopologicalSort<Name, DependencySort> {
      Module& wasm;
      const NameCountMap& counts;

      std::unordered_map<Name, std::vector<Name>> deps;

      DependencySort(Module& wasm, const NameCountMap& counts)
        : wasm(wasm), counts(counts) {
        // Sort a list of global names by their counts.
        auto sort = [&](std::vector<Name>& globals) {
          std::stable_sort(
            globals.begin(), globals.end(), [&](const Name& a, const Name& b) {
              return counts.at(a) < counts.at(b);
            });
        };

        // Sort the globals.
        std::vector<Name> sortedNames;
        for (auto& global : wasm.globals) {
          sortedNames.push_back(global->name);
        }
        sort(sortedNames);

        // Everything is a root (we need to emit all globals).
        for (auto global : sortedNames) {
          push(global);
        }

        // The dependencies are the globals referred to.
        for (auto& global : wasm.globals) {
          if (global->imported()) {
            continue;
          }
          std::vector<Name> vec;
          for (auto* get : FindAll<GlobalGet>(global->init).list) {
            vec.push_back(get->name);
          }
          sort(vec);
          deps[global->name] = std::move(vec);
        }
      }

      void pushPredecessors(Name global) {
        for (auto pred : deps[global]) {
          push(pred);
        }
      }
    };

    std::unordered_map<Name, Index> sortedIndexes;
    for (auto global : DependencySort(*module, counts)) {
      auto index = sortedIndexes.size();
      sortedIndexes[global] = index;
    }

    std::sort(
      module->globals.begin(),
      module->globals.end(),
      [&](const std::unique_ptr<Global>& a, const std::unique_ptr<Global>& b) {
        return sortedIndexes[a->name] < sortedIndexes[b->name];
      });

    module->updateMaps();
  }